

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkAlloc(Abc_NtkType_t Type,Abc_NtkFunc_t Func,int fUseMemMan)

{
  void **ppvVar1;
  Abc_Ntk_t *pNtkAig;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  Mem_Fixed_t *pMVar4;
  Mem_Step_t *pMVar5;
  DdManager *pDVar6;
  Nm_Man_t *pNVar7;
  
  pNtkAig = (Abc_Ntk_t *)calloc(1,0x1c8);
  pNtkAig->ntkType = Type;
  pNtkAig->ntkFunc = Func;
  pVVar2 = Vec_PtrAlloc(100);
  pNtkAig->vObjs = pVVar2;
  pVVar3 = Vec_PtrAlloc(100);
  pNtkAig->vPios = pVVar3;
  pVVar3 = Vec_PtrAlloc(100);
  pNtkAig->vPis = pVVar3;
  pVVar3 = Vec_PtrAlloc(100);
  pNtkAig->vPos = pVVar3;
  pVVar3 = Vec_PtrAlloc(100);
  pNtkAig->vCis = pVVar3;
  pVVar3 = Vec_PtrAlloc(100);
  pNtkAig->vCos = pVVar3;
  pVVar3 = Vec_PtrAlloc(100);
  pNtkAig->vBoxes = pVVar3;
  pVVar3 = Vec_PtrAlloc(100);
  pNtkAig->vLtlProperties = pVVar3;
  if (fUseMemMan == 0) {
    pNtkAig->pMmObj = (Mem_Fixed_t *)0x0;
    pMVar5 = (Mem_Step_t *)0x0;
  }
  else {
    pMVar4 = Mem_FixedStart(0x48);
    pNtkAig->pMmObj = pMVar4;
    pMVar5 = Mem_StepStart(10);
  }
  pNtkAig->pMmStep = pMVar5;
  pNtkAig->nTravIds = 1;
  if (Type == ABC_NTK_STRASH) {
    pDVar6 = (DdManager *)Abc_AigAlloc(pNtkAig);
  }
  else {
    Vec_PtrPush(pVVar2,(void *)0x0);
    switch(Func) {
    case ABC_FUNC_SOP:
    case ABC_FUNC_BLIFMV:
      pDVar6 = (DdManager *)Mem_FlexStart();
      break;
    case ABC_FUNC_BDD:
      pDVar6 = Cudd_Init(0x14,0,0x100,0x40000,0);
      break;
    case ABC_FUNC_AIG:
      pDVar6 = (DdManager *)Hop_ManStart();
      break;
    case ABC_FUNC_MAP:
      pDVar6 = (DdManager *)Abc_FrameReadLibGen();
      break;
    case ABC_FUNC_BLACKBOX:
      goto switchD_001dea3d_caseD_6;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                    ,0x5a,"Abc_Ntk_t *Abc_NtkAlloc(Abc_NtkType_t, Abc_NtkFunc_t, int)");
    }
  }
  pNtkAig->pManFunc = pDVar6;
switchD_001dea3d_caseD_6:
  pNVar7 = Nm_ManCreate(200);
  pNtkAig->pManName = pNVar7;
  pVVar2 = Vec_PtrAlloc(0xf);
  pVVar2->nSize = 0xf;
  ppvVar1 = pVVar2->pArray;
  ppvVar1[0xc] = (void *)0x0;
  ppvVar1[0xd] = (void *)0x0;
  ppvVar1[10] = (void *)0x0;
  ppvVar1[0xb] = (void *)0x0;
  ppvVar1[8] = (void *)0x0;
  ppvVar1[9] = (void *)0x0;
  ppvVar1[6] = (void *)0x0;
  ppvVar1[7] = (void *)0x0;
  ppvVar1[4] = (void *)0x0;
  ppvVar1[5] = (void *)0x0;
  ppvVar1[2] = (void *)0x0;
  ppvVar1[3] = (void *)0x0;
  *ppvVar1 = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  ppvVar1[0xe] = (void *)0x0;
  pNtkAig->vAttrs = pVVar2;
  pNtkAig->AndGateDelay = 0.0;
  return pNtkAig;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates a new Ntk.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Abc_NtkAlloc( Abc_NtkType_t Type, Abc_NtkFunc_t Func, int fUseMemMan )
{
    Abc_Ntk_t * pNtk;
    pNtk = ABC_ALLOC( Abc_Ntk_t, 1 );
    memset( pNtk, 0, sizeof(Abc_Ntk_t) );
    pNtk->ntkType     = Type;
    pNtk->ntkFunc     = Func;
    // start the object storage
    pNtk->vObjs       = Vec_PtrAlloc( 100 );
    pNtk->vPios       = Vec_PtrAlloc( 100 );
    pNtk->vPis        = Vec_PtrAlloc( 100 );
    pNtk->vPos        = Vec_PtrAlloc( 100 );
    pNtk->vCis        = Vec_PtrAlloc( 100 );
    pNtk->vCos        = Vec_PtrAlloc( 100 );
    pNtk->vBoxes      = Vec_PtrAlloc( 100 );
	pNtk->vLtlProperties = Vec_PtrAlloc( 100 );
    // start the memory managers
    pNtk->pMmObj      = fUseMemMan? Mem_FixedStart( sizeof(Abc_Obj_t) ) : NULL;
    pNtk->pMmStep     = fUseMemMan? Mem_StepStart( ABC_NUM_STEPS ) : NULL;
    // get ready to assign the first Obj ID
    pNtk->nTravIds    = 1;
    // start the functionality manager
    if ( !Abc_NtkIsStrash(pNtk) )
        Vec_PtrPush( pNtk->vObjs, NULL );
    if ( Abc_NtkIsStrash(pNtk) )
        pNtk->pManFunc = Abc_AigAlloc( pNtk );
    else if ( Abc_NtkHasSop(pNtk) || Abc_NtkHasBlifMv(pNtk) )
        pNtk->pManFunc = Mem_FlexStart();
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        pNtk->pManFunc = Cudd_Init( 20, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        pNtk->pManFunc = Hop_ManStart();
    else if ( Abc_NtkHasMapping(pNtk) )
        pNtk->pManFunc = Abc_FrameReadLibGen();
    else if ( !Abc_NtkHasBlackbox(pNtk) )
        assert( 0 );
    // name manager
    pNtk->pManName = Nm_ManCreate( 200 );
    // attribute manager
    pNtk->vAttrs = Vec_PtrStart( VEC_ATTR_TOTAL_NUM );
    // estimated AndGateDelay
    pNtk->AndGateDelay = 0.0;
    return pNtk;
}